

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManPropagate(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar2 = p->nObjs;
  if (1 < (long)(int)uVar2) {
    puVar8 = &p->pObjs[1].Value;
    lVar9 = (long)(int)uVar2 + -1;
    do {
      uVar10 = *(ulong *)(puVar8 + -2);
      uVar12 = (uint)uVar10;
      iVar11 = (int)(uVar10 & 0x1fffffff);
      if ((uVar10 & 0x1fffffff) == 0x1fffffff || (int)uVar12 < 0) {
        if ((int)uVar12 < 0 && iVar11 != 0x1fffffff) {
          *puVar8 = *puVar8 + (((uVar12 >> 0x1d & 1) != 0) + 0x31) *
                              *(int *)((long)puVar8 + (ulong)(uint)(iVar11 << 2) * -3);
        }
      }
      else {
        uVar12 = (uint)(uVar10 >> 0x1d) & 1;
        uVar14 = (uint)(uVar10 >> 0x3d) & 1;
        uVar10 = (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc);
        uVar13 = (uVar14 + 0x31) * *(int *)((long)puVar8 + uVar10 * -3) +
                 (uVar12 + 0x31) * *(int *)((long)puVar8 + (ulong)(uint)(iVar11 << 2) * -3) +
                 *puVar8;
        *puVar8 = uVar13;
        if ((uVar12 == uVar14) &&
           (*(int *)((long)puVar8 + (ulong)(uint)(iVar11 << 2) * -3) ==
            *(int *)((long)puVar8 + uVar10 * -3))) {
          *puVar8 = uVar13 + 0xdebbdff0;
        }
      }
      puVar8 = puVar8 + 3;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  iVar11 = p->nRegs;
  lVar9 = (long)iVar11;
  if (0 < lVar9) {
    pVVar6 = p->vCos;
    iVar3 = pVVar6->nSize;
    uVar10 = (ulong)(uint)(iVar3 - iVar11);
    iVar11 = -iVar11;
    do {
      if ((iVar3 + iVar11 < 0) || (iVar3 <= iVar3 + iVar11)) {
LAB_006caa1d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar6->pArray[uVar10];
      if (((long)iVar4 < 0) || ((int)uVar2 <= iVar4)) {
LAB_006ca9fe:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) {
        return;
      }
      iVar5 = p->vCis->nSize;
      uVar12 = iVar11 + iVar5;
      if (((int)uVar12 < 0) || (iVar5 <= (int)uVar12)) goto LAB_006caa1d;
      uVar12 = p->vCis->pArray[uVar12];
      if (((long)(int)uVar12 < 0) || (uVar2 <= uVar12)) goto LAB_006ca9fe;
      pGVar1 = pGVar7 + iVar4;
      pGVar7 = pGVar7 + (int)uVar12;
      uVar12 = pGVar7->Value + pGVar1->Value;
      pGVar7->Value = uVar12;
      if (pGVar7 == pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) {
        pGVar7->Value = uVar12 + 0x63ba1fa2;
      }
      iVar11 = iVar11 + 1;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void Gia_Iso2ManPropagate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i;
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value + (Gia_ObjFaninC1(pObj) + s_PrimeC) * Gia_ObjFanin1(pObj)->Value;
            if ( Gia_ObjFaninC0(pObj) == Gia_ObjFaninC1(pObj) && Gia_ObjFanin0(pObj)->Value == Gia_ObjFanin1(pObj)->Value )
                pObj->Value += s_256Primes[ISO_MASK - 11];
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value;
    Gia_ManForEachRiRo( p, pObj, pObjRo, i )
    {
        pObjRo->Value += pObj->Value;
        if ( pObjRo == Gia_ObjFanin0(pObj) )
            pObjRo->Value += s_256Primes[ISO_MASK - 12];
    }
}